

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn5s.hpp
# Opt level: O0

void __thiscall trng::yarn5s::backward(yarn5s *this)

{
  int iVar1;
  int32_t iVar2;
  int *in_RDI;
  int32_t in_stack_00000010;
  int32_t in_stack_00000014;
  result_type t;
  int local_c;
  
  if (in_RDI[4] == 0) {
    if (in_RDI[3] == 0) {
      if (in_RDI[2] == 0) {
        if (in_RDI[1] == 0) {
          if (*in_RDI == 0) {
            local_c = 0;
          }
          else {
            iVar1 = in_RDI[8];
            iVar2 = int_math::modulo_inverse(in_stack_00000014,in_stack_00000010);
            local_c = (int)(((long)iVar1 * (long)iVar2) % 0x7fffa78f);
          }
        }
        else {
          local_c = in_RDI[7] - (int)(((long)*in_RDI * (long)in_RDI[8]) % 0x7fffa78f);
          if (local_c < 0) {
            local_c = local_c + 0x7fffa78f;
          }
          iVar2 = int_math::modulo_inverse(in_stack_00000014,in_stack_00000010);
          local_c = (int)(((long)local_c * (long)iVar2) % 0x7fffa78f);
        }
      }
      else {
        local_c = in_RDI[6] - (int)(((long)*in_RDI * (long)in_RDI[7]) % 0x7fffa78f);
        if (local_c < 0) {
          local_c = local_c + 0x7fffa78f;
        }
        local_c = local_c - (int)(((long)in_RDI[1] * (long)in_RDI[8]) % 0x7fffa78f);
        if (local_c < 0) {
          local_c = local_c + 0x7fffa78f;
        }
        iVar2 = int_math::modulo_inverse(in_stack_00000014,in_stack_00000010);
        local_c = (int)(((long)local_c * (long)iVar2) % 0x7fffa78f);
      }
    }
    else {
      local_c = in_RDI[5] - (int)(((long)*in_RDI * (long)in_RDI[6]) % 0x7fffa78f);
      if (local_c < 0) {
        local_c = local_c + 0x7fffa78f;
      }
      local_c = local_c - (int)(((long)in_RDI[1] * (long)in_RDI[7]) % 0x7fffa78f);
      if (local_c < 0) {
        local_c = local_c + 0x7fffa78f;
      }
      local_c = local_c - (int)(((long)in_RDI[2] * (long)in_RDI[8]) % 0x7fffa78f);
      if (local_c < 0) {
        local_c = local_c + 0x7fffa78f;
      }
      iVar2 = int_math::modulo_inverse(in_stack_00000014,in_stack_00000010);
      local_c = (int)(((long)local_c * (long)iVar2) % 0x7fffa78f);
    }
  }
  else {
    local_c = in_RDI[5] - (int)(((long)*in_RDI * (long)in_RDI[6]) % 0x7fffa78f);
    if (local_c < 0) {
      local_c = local_c + 0x7fffa78f;
    }
    local_c = local_c - (int)(((long)in_RDI[1] * (long)in_RDI[7]) % 0x7fffa78f);
    if (local_c < 0) {
      local_c = local_c + 0x7fffa78f;
    }
    local_c = local_c - (int)(((long)in_RDI[2] * (long)in_RDI[8]) % 0x7fffa78f);
    if (local_c < 0) {
      local_c = local_c + 0x7fffa78f;
    }
    local_c = local_c - (int)(((long)in_RDI[3] * (long)in_RDI[9]) % 0x7fffa78f);
    if (local_c < 0) {
      local_c = local_c + 0x7fffa78f;
    }
    iVar2 = int_math::modulo_inverse(in_stack_00000014,in_stack_00000010);
    local_c = (int)(((long)local_c * (long)iVar2) % 0x7fffa78f);
  }
  in_RDI[5] = in_RDI[6];
  in_RDI[6] = in_RDI[7];
  in_RDI[7] = in_RDI[8];
  in_RDI[8] = in_RDI[9];
  in_RDI[9] = local_c;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn5s::backward() {
    result_type t;
    if (P.a[4] != 0) {
      t = S.r[0];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[1])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[2]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[3]) * static_cast<int64_t>(S.r[4])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[4], modulus))) %
          modulus);
    } else if (P.a[3] != 0) {
      t = S.r[0];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[1])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[2]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[3], modulus))) %
          modulus);
    } else if (P.a[2] != 0) {
      t = S.r[1];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[2], modulus))) %
          modulus);
    } else if (P.a[1] != 0) {
      t = S.r[2];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[1], modulus))) %
          modulus);
    } else if (P.a[0] != 0) {
      t = S.r[3];
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[0], modulus))) %
          modulus);
    } else
      t = 0;
    S.r[0] = S.r[1];
    S.r[1] = S.r[2];
    S.r[2] = S.r[3];
    S.r[3] = S.r[4];
    S.r[4] = t;
  }